

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polylinecurve.cpp
# Opt level: O2

ON_PolylineCurve * __thiscall
ON_PolylineCurve::operator=(ON_PolylineCurve *this,ON_PolylineCurve *src)

{
  if (this != src) {
    ON_Curve::operator=(&this->super_ON_Curve,&src->super_ON_Curve);
    ON_3dPointArray::operator=
              (&(this->m_pline).super_ON_3dPointArray,&(src->m_pline).super_ON_3dPointArray);
    ON_SimpleArray<double>::operator=(&this->m_t,&src->m_t);
    this->m_dim = src->m_dim;
  }
  return this;
}

Assistant:

ON_PolylineCurve& ON_PolylineCurve::operator=(const ON_PolylineCurve& src)
{
  if (this != &src)
  {
    ON_Curve::operator=(src);
    m_pline = src.m_pline;
    m_t = src.m_t;
    m_dim = src.m_dim;
  }
  return *this;
}